

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

CURLcode curl_mime_name(curl_mimepart *part,char *name)

{
  char *pcVar1;
  
  if (part == (curl_mimepart *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  (*Curl_cfree)(part->name);
  part->name = (char *)0x0;
  if (name != (char *)0x0) {
    pcVar1 = (*Curl_cstrdup)(name);
    part->name = pcVar1;
    if (pcVar1 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode curl_mime_name(curl_mimepart *part, const char *name)
{
  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  Curl_safefree(part->name);

  if(name) {
    part->name = strdup(name);
    if(!part->name)
      return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}